

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessOpDatasetJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  ErrorCode EVar3;
  pointer pbVar4;
  element_type *peVar5;
  bool bVar6;
  bool bVar7;
  Status SVar8;
  Value *pVVar9;
  char *pcVar10;
  char *pcVar11;
  Timestamp *aTimestamp;
  Channel *aChannel;
  ChannelMask *aChannelMask;
  ByteArray *aBytes;
  ByteArray *aBytes_00;
  ByteArray *aBytes_01;
  SecurityPolicy *aSecurityPolicy;
  ActiveOperationalDataset *aDataset;
  PendingOperationalDataset *aDataset_00;
  ByteArray *aPrefix;
  Timestamp *this_00;
  string *psVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string *psVar13;
  initializer_list<unsigned_char> __l;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  format_args args_11;
  format_args args_12;
  format_args args_13;
  format_args args_14;
  Timestamp activeTimestamp;
  string prefix;
  ChannelMask channelMask;
  string local_b70 [32];
  uint local_b50;
  allocator_type local_b3a;
  allocator_type local_b39;
  ActiveOperationalDataset dataset;
  uint32_t delay;
  pointer pbStack_a50;
  pointer local_a48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> xpans;
  writer write;
  StringArray unresolved;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_9e8;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  undefined1 local_850 [40];
  Error local_828;
  undefined1 local_800 [40];
  undefined1 local_7d8 [40];
  undefined1 local_7b0 [40];
  undefined1 local_788 [40];
  undefined1 local_760 [40];
  Error local_738;
  undefined1 local_710 [40];
  undefined1 local_6e8 [40];
  undefined1 local_6c0 [40];
  Error local_698;
  undefined1 local_670 [40];
  undefined1 local_648 [40];
  Error local_620;
  undefined1 local_5f8 [40];
  undefined1 local_5d0 [40];
  undefined1 local_5a8 [40];
  Error local_580;
  undefined1 local_558 [40];
  Error local_530;
  undefined1 local_508 [40];
  undefined1 local_4e0 [40];
  undefined1 local_4b8 [40];
  Error local_490;
  undefined1 local_468 [40];
  undefined1 local_440 [40];
  Error local_418;
  undefined1 local_3f0 [40];
  undefined1 local_3c8 [40];
  Error local_3a0;
  undefined1 local_378 [40];
  undefined1 local_350 [40];
  Error local_328;
  undefined1 local_300 [40];
  undefined1 local_2d8 [40];
  undefined1 local_2b0 [40];
  undefined1 local_288 [40];
  Error local_260;
  undefined1 local_238 [40];
  undefined1 local_210 [40];
  undefined1 local_1e8 [40];
  undefined1 local_1c0 [40];
  Error local_198;
  undefined1 local_170 [40];
  undefined1 local_148 [40];
  undefined1 local_120 [40];
  undefined1 local_f8 [40];
  Error local_d0;
  Error local_a8;
  Error local_80;
  Error local_58;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  pbVar4 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) < 0x41) {
    channelMask.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)channelMask.
                          super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    channelMask.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_1d3340;
    channelMask.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x11;
    pcVar10 = "too few arguments";
    while (pcVar11 = pcVar10, pcVar11 != "") {
      pcVar10 = pcVar11 + 1;
      if (*pcVar11 == '}') {
        if ((pcVar10 == "") || (*pcVar10 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar10 = pcVar11 + 2;
      }
      else if (*pcVar11 == '{') {
        pcVar10 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                            (pcVar11,"",(format_string_checker<char> *)&channelMask);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&channelMask;
    ::fmt::v10::vformat_abi_cxx11_
              (&prefix,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    psVar12 = &local_58.mMessage;
    local_58.mCode = kInvalidArgs;
    std::__cxx11::string::string((string *)psVar12,(string *)&prefix);
    Value::Value((Value *)&dataset,&local_58);
LAB_001974ec:
    Value::operator=(__return_storage_ptr__,(Value *)&dataset);
    Value::~Value((Value *)&dataset);
LAB_0019750a:
    std::__cxx11::string::~string((string *)psVar12);
  }
  else {
    std::__cxx11::string::string((string *)&dataset,"get",(allocator *)&channelMask);
    bVar6 = CaseInsensitiveEqual(pbVar4 + 1,(string *)&dataset);
    std::__cxx11::string::~string((string *)&dataset);
    if (!bVar6) {
      pbVar4 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&dataset,"set",(allocator *)&channelMask);
      bVar7 = CaseInsensitiveEqual(pbVar4 + 1,(string *)&dataset);
      std::__cxx11::string::~string((string *)&dataset);
      if (!bVar7) {
        channelMask.
        super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(channelMask.
                               super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0xd);
        channelMask.
        super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_1d8a33;
        channelMask.
        super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1f;
        pcVar10 = "\'{}\' is not a valid sub-command";
        while (pcVar11 = pcVar10, pcVar11 != "") {
          pcVar10 = pcVar11 + 1;
          if (*pcVar11 == '}') {
            if ((pcVar10 == "") || (*pcVar10 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar10 = pcVar11 + 2;
          }
          else if (*pcVar11 == '{') {
            pcVar10 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                (pcVar11,"",(format_string_checker<char> *)&channelMask);
          }
        }
        pbVar4 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        channelMask.
        super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pbVar4[1]._M_dataplus._M_p;
        channelMask.
        super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)pbVar4[1]._M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x1f;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)&channelMask;
        ::fmt::v10::vformat_abi_cxx11_
                  (&prefix,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_00);
        psVar12 = &local_80.mMessage;
        local_80.mCode = kInvalidCommand;
        std::__cxx11::string::string((string *)psVar12,(string *)&prefix);
        Value::Value((Value *)&dataset,&local_80);
        goto LAB_001974ec;
      }
    }
    pbVar4 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&dataset,"activetimestamp",(allocator *)&channelMask);
    bVar7 = CaseInsensitiveEqual(pbVar4 + 2,(string *)&dataset);
    std::__cxx11::string::~string((string *)&dataset);
    if (bVar7) {
      if (bVar6) {
        peVar5 = (aCommissioner->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x1d])
                  (local_288,peVar5,&activeTimestamp);
        Value::Value((Value *)&dataset,(Error *)local_288);
        pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
        EVar3 = (pVVar9->mError).mCode;
        Value::~Value((Value *)&dataset);
        std::__cxx11::string::~string((string *)(local_288 + 8));
        if (EVar3 != kNone) {
          return __return_storage_ptr__;
        }
        ToString_abi_cxx11_(&local_870,(Interpreter *)&activeTimestamp,aTimestamp);
        Value::Value((Value *)&dataset,&local_870);
        Value::operator=(__return_storage_ptr__,(Value *)&dataset);
        Value::~Value((Value *)&dataset);
        psVar12 = &local_870;
        goto LAB_00197514;
      }
      channelMask.
      super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)channelMask.
                            super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      channelMask.
      super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_1d9717;
      channelMask.
      super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1a;
      pcVar10 = "cannot set activetimestamp";
      while (pcVar11 = pcVar10, pcVar11 != "") {
        pcVar10 = pcVar11 + 1;
        if (*pcVar11 == '}') {
          if ((pcVar10 == "") || (*pcVar10 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar10 = pcVar11 + 2;
        }
        else if (*pcVar11 == '{') {
          pcVar10 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar11,"",(format_string_checker<char> *)&channelMask);
        }
      }
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&channelMask;
      ::fmt::v10::vformat_abi_cxx11_
                (&prefix,(v10 *)"cannot set activetimestamp",(string_view)ZEXT816(0x1a),args_01);
      psVar12 = &local_a8.mMessage;
      local_a8.mCode = kInvalidArgs;
      std::__cxx11::string::string((string *)psVar12,(string *)&prefix);
      Value::Value((Value *)&dataset,&local_a8);
      goto LAB_001974ec;
    }
    pbVar4 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&dataset,"channel",(allocator *)&channelMask);
    bVar7 = CaseInsensitiveEqual(pbVar4 + 2,(string *)&dataset);
    std::__cxx11::string::~string((string *)&dataset);
    if (bVar7) {
      if (bVar6) {
        peVar5 = (aCommissioner->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x1e])
                  (local_350,peVar5,&activeTimestamp);
        Value::Value((Value *)&dataset,(Error *)local_350);
        pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
        EVar3 = (pVVar9->mError).mCode;
        Value::~Value((Value *)&dataset);
        std::__cxx11::string::~string((string *)(local_350 + 8));
        if (EVar3 != kNone) {
          return __return_storage_ptr__;
        }
        ToString_abi_cxx11_(&local_890,(Interpreter *)&activeTimestamp,aChannel);
        Value::Value((Value *)&dataset,&local_890);
        Value::operator=(__return_storage_ptr__,(Value *)&dataset);
        Value::~Value((Value *)&dataset);
        psVar12 = &local_890;
        goto LAB_00197514;
      }
      pbVar4 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (0xa0 < (ulong)((long)(aExpr->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4)) {
        utils::ParseInteger<unsigned_char>((Error *)local_2b0,(uchar *)&activeTimestamp,pbVar4 + 3);
        Value::Value((Value *)&dataset,(Error *)local_2b0);
        pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
        EVar3 = (pVVar9->mError).mCode;
        Value::~Value((Value *)&dataset);
        std::__cxx11::string::~string((string *)(local_2b0 + 8));
        if (EVar3 != kNone) {
          return __return_storage_ptr__;
        }
        utils::ParseInteger<unsigned_short>
                  ((Error *)local_2d8,(unsigned_short *)&activeTimestamp.field_0x2,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 4);
        Value::Value((Value *)&dataset,(Error *)local_2d8);
        pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
        EVar3 = (pVVar9->mError).mCode;
        Value::~Value((Value *)&dataset);
        std::__cxx11::string::~string((string *)(local_2d8 + 8));
        if (EVar3 != kNone) {
          return __return_storage_ptr__;
        }
        utils::ParseInteger<unsigned_int>
                  ((Error *)local_300,&delay,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 5);
        Value::Value((Value *)&dataset,(Error *)local_300);
        pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
        EVar3 = (pVVar9->mError).mCode;
        Value::~Value((Value *)&dataset);
        std::__cxx11::string::~string((string *)(local_300 + 8));
        if (EVar3 != kNone) {
          return __return_storage_ptr__;
        }
        peVar5 = (aCommissioner->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x1f])
                  (&local_328,peVar5,&activeTimestamp,(ulong)_delay & 0xffffffff);
        Value::Value((Value *)&dataset,&local_328);
        Value::operator=(__return_storage_ptr__,(Value *)&dataset);
        Value::~Value((Value *)&dataset);
        psVar12 = &local_328.mMessage;
        goto LAB_00197514;
      }
      channelMask.
      super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)channelMask.
                            super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      channelMask.
      super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_1d3340;
      channelMask.
      super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x11;
      pcVar10 = "too few arguments";
      while (pcVar11 = pcVar10, pcVar11 != "") {
        pcVar10 = pcVar11 + 1;
        if (*pcVar11 == '}') {
          if ((pcVar10 == "") || (*pcVar10 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar10 = pcVar11 + 2;
        }
        else if (*pcVar11 == '{') {
          pcVar10 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar11,"",(format_string_checker<char> *)&channelMask);
        }
      }
      args_02.field_1.args_ = in_R9.args_;
      args_02.desc_ = (unsigned_long_long)&channelMask;
      ::fmt::v10::vformat_abi_cxx11_
                (&prefix,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_02);
      psVar12 = &local_d0.mMessage;
      local_d0.mCode = kInvalidArgs;
      std::__cxx11::string::string((string *)psVar12,(string *)&prefix);
      Value::Value((Value *)&dataset,&local_d0);
      goto LAB_001974ec;
    }
    pbVar4 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&dataset,"channelmask",(allocator *)&channelMask);
    bVar7 = CaseInsensitiveEqual(pbVar4 + 2,(string *)&dataset);
    std::__cxx11::string::~string((string *)&dataset);
    if (bVar7) {
      channelMask.
      super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      channelMask.
      super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      channelMask.
      super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (bVar6) {
        peVar5 = (aCommissioner->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x20])
                  (local_3c8,peVar5,&channelMask);
        Value::Value((Value *)&dataset,(Error *)local_3c8);
        pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
        EVar3 = (pVVar9->mError).mCode;
        Value::~Value((Value *)&dataset);
        std::__cxx11::string::~string((string *)(local_3c8 + 8));
        if (EVar3 != kNone) goto LAB_00197cf8;
        ToString_abi_cxx11_(&local_8b0,(Interpreter *)&channelMask,aChannelMask);
        Value::Value((Value *)&dataset,&local_8b0);
        Value::operator=(__return_storage_ptr__,(Value *)&dataset);
        Value::~Value((Value *)&dataset);
        psVar12 = &local_8b0;
      }
      else {
        ParseChannelMask((Error *)local_378,&channelMask,aExpr,3);
        Value::Value((Value *)&dataset,(Error *)local_378);
        pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
        EVar3 = (pVVar9->mError).mCode;
        Value::~Value((Value *)&dataset);
        std::__cxx11::string::~string((string *)(local_378 + 8));
        if (EVar3 != kNone) goto LAB_00197cf8;
        peVar5 = (aCommissioner->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x21])
                  (&local_3a0,peVar5,&channelMask);
        Value::Value((Value *)&dataset,&local_3a0);
        Value::operator=(__return_storage_ptr__,(Value *)&dataset);
        Value::~Value((Value *)&dataset);
        psVar12 = &local_3a0.mMessage;
      }
      std::__cxx11::string::~string((string *)psVar12);
LAB_00197cf8:
      std::
      vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ::~vector(&channelMask);
      return __return_storage_ptr__;
    }
    pbVar4 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&dataset,"xpanid",(allocator *)&channelMask);
    bVar7 = CaseInsensitiveEqual(pbVar4 + 2,(string *)&dataset);
    std::__cxx11::string::~string((string *)&dataset);
    if (bVar7) {
      activeTimestamp = (Timestamp)0x0;
      if (bVar6) {
        peVar5 = (aCommissioner->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x22])
                  (local_440,peVar5,&activeTimestamp);
        Value::Value((Value *)&dataset,(Error *)local_440);
        pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
        EVar3 = (pVVar9->mError).mCode;
        Value::~Value((Value *)&dataset);
        std::__cxx11::string::~string((string *)(local_440 + 8));
        if (EVar3 == kNone) {
          utils::Hex_abi_cxx11_(&local_8d0,(utils *)&activeTimestamp,aBytes);
          Value::Value((Value *)&dataset,&local_8d0);
          Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          Value::~Value((Value *)&dataset);
          psVar12 = &local_8d0;
          goto LAB_00198349;
        }
      }
      else {
        pbVar4 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(aExpr->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) < 0x61) {
          channelMask.
          super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)channelMask.
                                super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
          channelMask.
          super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_1d3340;
          channelMask.
          super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x11;
          pcVar10 = "too few arguments";
          while (pcVar11 = pcVar10, pcVar11 != "") {
            pcVar10 = pcVar11 + 1;
            if (*pcVar11 == '}') {
              if ((pcVar10 == "") || (*pcVar10 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar10 = pcVar11 + 2;
            }
            else if (*pcVar11 == '{') {
              pcVar10 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                  (pcVar11,"",(format_string_checker<char> *)&channelMask);
            }
          }
          args_03.field_1.args_ = in_R9.args_;
          args_03.desc_ = (unsigned_long_long)&channelMask;
          ::fmt::v10::vformat_abi_cxx11_
                    (&prefix,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_03);
          psVar13 = (string *)(local_f8 + 8);
          local_f8._0_4_ = kInvalidArgs;
          std::__cxx11::string::string(psVar13,(string *)&prefix);
          Value::Value((Value *)&dataset,(Error *)local_f8);
LAB_00198321:
          Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          Value::~Value((Value *)&dataset);
          std::__cxx11::string::~string(psVar13);
          psVar12 = &prefix;
        }
        else {
          utils::Hex((Error *)local_3f0,(ByteArray *)&activeTimestamp,pbVar4 + 3);
          Value::Value((Value *)&dataset,(Error *)local_3f0);
          pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          EVar3 = (pVVar9->mError).mCode;
          Value::~Value((Value *)&dataset);
          std::__cxx11::string::~string((string *)(local_3f0 + 8));
          if (EVar3 != kNone) goto LAB_0019834e;
          peVar5 = (aCommissioner->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x23])
                    (&local_418,peVar5,&activeTimestamp);
          Value::Value((Value *)&dataset,&local_418);
          Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          Value::~Value((Value *)&dataset);
          psVar12 = &local_418.mMessage;
        }
LAB_00198349:
        std::__cxx11::string::~string((string *)psVar12);
      }
LAB_0019834e:
      this_00 = &activeTimestamp;
LAB_00198353:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
      return __return_storage_ptr__;
    }
    pbVar4 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&dataset,"meshlocalprefix",(allocator *)&channelMask);
    bVar7 = CaseInsensitiveEqual(pbVar4 + 2,(string *)&dataset);
    std::__cxx11::string::~string((string *)&dataset);
    paVar1 = &prefix.field_2;
    if (!bVar7) {
      pbVar4 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&dataset,"networkmasterkey",(allocator *)&channelMask);
      bVar7 = CaseInsensitiveEqual(pbVar4 + 2,(string *)&dataset);
      std::__cxx11::string::~string((string *)&dataset);
      if (bVar7) {
        activeTimestamp = (Timestamp)0x0;
        if (bVar6) {
          peVar5 = (aCommissioner->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x27])
                    (local_558,peVar5,&activeTimestamp);
          Value::Value((Value *)&dataset,(Error *)local_558);
          pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          EVar3 = (pVVar9->mError).mCode;
          Value::~Value((Value *)&dataset);
          std::__cxx11::string::~string((string *)(local_558 + 8));
          if (EVar3 == kNone) {
            utils::Hex_abi_cxx11_(&local_910,(utils *)&activeTimestamp,aBytes_00);
            Value::Value((Value *)&dataset,&local_910);
            Value::operator=(__return_storage_ptr__,(Value *)&dataset);
            Value::~Value((Value *)&dataset);
            psVar12 = &local_910;
            goto LAB_00198349;
          }
        }
        else {
          pbVar4 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(aExpr->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) < 0x81) {
            channelMask.
            super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((ulong)channelMask.
                                  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
            channelMask.
            super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_1d3340;
            channelMask.
            super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x11;
            pcVar10 = "too few arguments";
            while (pcVar11 = pcVar10, pcVar11 != "") {
              pcVar10 = pcVar11 + 1;
              if (*pcVar11 == '}') {
                if ((pcVar10 == "") || (*pcVar10 != '}')) {
                  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                }
                pcVar10 = pcVar11 + 2;
              }
              else if (*pcVar11 == '{') {
                pcVar10 = ::fmt::v10::detail::
                          parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                    (pcVar11,"",(format_string_checker<char> *)&channelMask);
              }
            }
            args_05.field_1.args_ = in_R9.args_;
            args_05.desc_ = (unsigned_long_long)&channelMask;
            ::fmt::v10::vformat_abi_cxx11_
                      (&prefix,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_05);
            psVar13 = (string *)(local_148 + 8);
            local_148._0_4_ = kInvalidArgs;
            std::__cxx11::string::string(psVar13,(string *)&prefix);
            Value::Value((Value *)&dataset,(Error *)local_148);
            goto LAB_00198321;
          }
          utils::Hex((Error *)local_4e0,(ByteArray *)&activeTimestamp,pbVar4 + 3);
          Value::Value((Value *)&dataset,(Error *)local_4e0);
          pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          EVar3 = (pVVar9->mError).mCode;
          Value::~Value((Value *)&dataset);
          std::__cxx11::string::~string((string *)(local_4e0 + 8));
          if (EVar3 == kNone) {
            utils::ParseInteger<unsigned_int>
                      ((Error *)local_508,&delay,
                       (aExpr->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 4);
            Value::Value((Value *)&dataset,(Error *)local_508);
            pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
            EVar3 = (pVVar9->mError).mCode;
            Value::~Value((Value *)&dataset);
            std::__cxx11::string::~string((string *)(local_508 + 8));
            if (EVar3 == kNone) {
              peVar5 = (aCommissioner->
                       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x28])
                        (&local_530,peVar5,&activeTimestamp,(ulong)_delay & 0xffffffff);
              Value::Value((Value *)&dataset,&local_530);
              Value::operator=(__return_storage_ptr__,(Value *)&dataset);
              Value::~Value((Value *)&dataset);
              psVar12 = &local_530.mMessage;
              goto LAB_00198349;
            }
          }
        }
        goto LAB_0019834e;
      }
      pbVar4 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&dataset,"networkname",(allocator *)&channelMask);
      bVar7 = CaseInsensitiveEqual(pbVar4 + 2,(string *)&dataset);
      std::__cxx11::string::~string((string *)&dataset);
      if (bVar7) {
        prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
        prefix._M_string_length = 0;
        prefix.field_2._M_allocated_capacity =
             prefix.field_2._M_allocated_capacity & 0xffffffffffffff00;
        if (bVar6) {
          peVar5 = (aCommissioner->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x29])
                    (local_5a8,peVar5,&prefix);
          Value::Value((Value *)&dataset,(Error *)local_5a8);
          pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          EVar3 = (pVVar9->mError).mCode;
          Value::~Value((Value *)&dataset);
          std::__cxx11::string::~string((string *)(local_5a8 + 8));
          if (EVar3 != kNone) goto LAB_0019750f;
          std::__cxx11::string::string((string *)&local_930,(string *)&prefix);
          Value::Value((Value *)&dataset,&local_930);
          Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          Value::~Value((Value *)&dataset);
          psVar12 = &local_930;
        }
        else {
          pbVar4 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(aExpr->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) < 0x61) {
            channelMask.
            super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((ulong)channelMask.
                                  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
            channelMask.
            super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_1d3340;
            channelMask.
            super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x11;
            pcVar10 = "too few arguments";
            while (pcVar11 = pcVar10, pcVar11 != "") {
              pcVar10 = pcVar11 + 1;
              if (*pcVar11 == '}') {
                if ((pcVar10 == "") || (*pcVar10 != '}')) {
                  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                }
                pcVar10 = pcVar11 + 2;
              }
              else if (*pcVar11 == '{') {
                pcVar10 = ::fmt::v10::detail::
                          parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                    (pcVar11,"",(format_string_checker<char> *)&channelMask);
              }
            }
            args_06.field_1.args_ = in_R9.args_;
            args_06.desc_ = (unsigned_long_long)&channelMask;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)&activeTimestamp,(v10 *)"too few arguments",
                       (string_view)ZEXT816(0x11),args_06);
            psVar13 = (string *)(local_170 + 8);
            local_170._0_4_ = kInvalidArgs;
            std::__cxx11::string::string(psVar13,(string *)&activeTimestamp);
            Value::Value((Value *)&dataset,(Error *)local_170);
            goto LAB_00198673;
          }
          peVar5 = (aCommissioner->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x2a])
                    (&local_580,peVar5,pbVar4 + 3);
          Value::Value((Value *)&dataset,&local_580);
          Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          Value::~Value((Value *)&dataset);
          psVar12 = &local_580.mMessage;
        }
        goto LAB_0019750a;
      }
      pbVar4 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&dataset,"panid",(allocator *)&channelMask);
      bVar7 = CaseInsensitiveEqual(pbVar4 + 2,(string *)&dataset);
      std::__cxx11::string::~string((string *)&dataset);
      if (bVar7) {
        if (bVar6) {
          peVar5 = (aCommissioner->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x2b])
                    (local_648,peVar5,&delay);
          Value::Value((Value *)&dataset,(Error *)local_648);
          pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          EVar3 = (pVVar9->mError).mCode;
          Value::~Value((Value *)&dataset);
          std::__cxx11::string::~string((string *)(local_648 + 8));
          if (EVar3 != kNone) {
            return __return_storage_ptr__;
          }
          utils::Hex<unsigned_short>(&local_950,(unsigned_short)delay);
          Value::Value((Value *)&dataset,&local_950);
          Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          Value::~Value((Value *)&dataset);
          psVar12 = &local_950;
          goto LAB_00197514;
        }
        pbVar4 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (0x80 < (ulong)((long)(aExpr->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4)) {
          utils::ParseInteger<unsigned_short>
                    ((Error *)local_5d0,(unsigned_short *)&delay,pbVar4 + 3);
          Value::Value((Value *)&dataset,(Error *)local_5d0);
          pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          EVar3 = (pVVar9->mError).mCode;
          Value::~Value((Value *)&dataset);
          std::__cxx11::string::~string((string *)(local_5d0 + 8));
          if (EVar3 != kNone) {
            return __return_storage_ptr__;
          }
          utils::ParseInteger<unsigned_int>
                    ((Error *)local_5f8,(uint *)&activeTimestamp,
                     (aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 4);
          Value::Value((Value *)&dataset,(Error *)local_5f8);
          pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          EVar3 = (pVVar9->mError).mCode;
          Value::~Value((Value *)&dataset);
          std::__cxx11::string::~string((string *)(local_5f8 + 8));
          if (EVar3 != kNone) {
            return __return_storage_ptr__;
          }
          peVar5 = (aCommissioner->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x2c])
                    (&local_620,peVar5,(ulong)_delay & 0xffff,(ulong)activeTimestamp & 0xffffffff);
          Value::Value((Value *)&dataset,&local_620);
          Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          Value::~Value((Value *)&dataset);
          psVar12 = &local_620.mMessage;
          goto LAB_00197514;
        }
        channelMask.
        super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)channelMask.
                              super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
        channelMask.
        super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_1d3340;
        channelMask.
        super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x11;
        pcVar10 = "too few arguments";
        while (pcVar11 = pcVar10, pcVar11 != "") {
          pcVar10 = pcVar11 + 1;
          if (*pcVar11 == '}') {
            if ((pcVar10 == "") || (*pcVar10 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar10 = pcVar11 + 2;
          }
          else if (*pcVar11 == '{') {
            pcVar10 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                (pcVar11,"",(format_string_checker<char> *)&channelMask);
          }
        }
        args_07.field_1.args_ = in_R9.args_;
        args_07.desc_ = (unsigned_long_long)&channelMask;
        ::fmt::v10::vformat_abi_cxx11_
                  (&prefix,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_07);
        psVar12 = &local_198.mMessage;
        local_198.mCode = kInvalidArgs;
        std::__cxx11::string::string((string *)psVar12,(string *)&prefix);
        Value::Value((Value *)&dataset,&local_198);
        goto LAB_001974ec;
      }
      pbVar4 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&dataset,"pskc",(allocator *)&channelMask);
      bVar7 = CaseInsensitiveEqual(pbVar4 + 2,(string *)&dataset);
      std::__cxx11::string::~string((string *)&dataset);
      if (bVar7) {
        activeTimestamp = (Timestamp)0x0;
        if (bVar6) {
          peVar5 = (aCommissioner->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x2d])
                    (local_6c0,peVar5,&activeTimestamp);
          Value::Value((Value *)&dataset,(Error *)local_6c0);
          pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          EVar3 = (pVVar9->mError).mCode;
          Value::~Value((Value *)&dataset);
          std::__cxx11::string::~string((string *)(local_6c0 + 8));
          if (EVar3 == kNone) {
            utils::Hex_abi_cxx11_(&local_970,(utils *)&activeTimestamp,aBytes_01);
            Value::Value((Value *)&dataset,&local_970);
            Value::operator=(__return_storage_ptr__,(Value *)&dataset);
            Value::~Value((Value *)&dataset);
            psVar12 = &local_970;
            goto LAB_00198349;
          }
        }
        else {
          pbVar4 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(aExpr->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) < 0x61) {
            channelMask.
            super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((ulong)channelMask.
                                  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
            channelMask.
            super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_1d3340;
            channelMask.
            super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x11;
            pcVar10 = "too few arguments";
            while (pcVar11 = pcVar10, pcVar11 != "") {
              pcVar10 = pcVar11 + 1;
              if (*pcVar11 == '}') {
                if ((pcVar10 == "") || (*pcVar10 != '}')) {
                  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                }
                pcVar10 = pcVar11 + 2;
              }
              else if (*pcVar11 == '{') {
                pcVar10 = ::fmt::v10::detail::
                          parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                    (pcVar11,"",(format_string_checker<char> *)&channelMask);
              }
            }
            args_08.field_1.args_ = in_R9.args_;
            args_08.desc_ = (unsigned_long_long)&channelMask;
            ::fmt::v10::vformat_abi_cxx11_
                      (&prefix,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_08);
            psVar13 = (string *)(local_1c0 + 8);
            local_1c0._0_4_ = kInvalidArgs;
            std::__cxx11::string::string(psVar13,(string *)&prefix);
            Value::Value((Value *)&dataset,(Error *)local_1c0);
            goto LAB_00198321;
          }
          utils::Hex((Error *)local_670,(ByteArray *)&activeTimestamp,pbVar4 + 3);
          Value::Value((Value *)&dataset,(Error *)local_670);
          pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          EVar3 = (pVVar9->mError).mCode;
          Value::~Value((Value *)&dataset);
          std::__cxx11::string::~string((string *)(local_670 + 8));
          if (EVar3 == kNone) {
            peVar5 = (aCommissioner->
                     super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x2e])
                      (&local_698,peVar5,&activeTimestamp);
            Value::Value((Value *)&dataset,&local_698);
            Value::operator=(__return_storage_ptr__,(Value *)&dataset);
            Value::~Value((Value *)&dataset);
            psVar12 = &local_698.mMessage;
            goto LAB_00198349;
          }
        }
        goto LAB_0019834e;
      }
      pbVar4 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&dataset,"securitypolicy",(allocator *)&channelMask);
      bVar7 = CaseInsensitiveEqual(pbVar4 + 2,(string *)&dataset);
      std::__cxx11::string::~string((string *)&dataset);
      if (bVar7) {
        this_00 = (Timestamp *)&prefix._M_string_length;
        prefix._M_string_length = 0;
        prefix.field_2._M_allocated_capacity = 0;
        prefix.field_2._8_8_ = 0;
        if (bVar6) {
          peVar5 = (aCommissioner->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x2f])
                    (local_760,peVar5,&prefix);
          Value::Value((Value *)&dataset,(Error *)local_760);
          pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          EVar3 = (pVVar9->mError).mCode;
          Value::~Value((Value *)&dataset);
          std::__cxx11::string::~string((string *)(local_760 + 8));
          if (EVar3 != kNone) goto LAB_00198353;
          ToString_abi_cxx11_(&local_990,(Interpreter *)&prefix,aSecurityPolicy);
          Value::Value((Value *)&dataset,&local_990);
          Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          Value::~Value((Value *)&dataset);
          psVar12 = &local_990;
        }
        else {
          pbVar4 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(aExpr->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) < 0x81) {
            channelMask.
            super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((ulong)channelMask.
                                  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
            channelMask.
            super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_1d3340;
            channelMask.
            super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x11;
            pcVar10 = "too few arguments";
            while (pcVar11 = pcVar10, pcVar11 != "") {
              pcVar10 = pcVar11 + 1;
              if (*pcVar11 == '}') {
                if ((pcVar10 == "") || (*pcVar10 != '}')) {
                  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                }
                pcVar10 = pcVar11 + 2;
              }
              else if (*pcVar11 == '{') {
                pcVar10 = ::fmt::v10::detail::
                          parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                    (pcVar11,"",(format_string_checker<char> *)&channelMask);
              }
            }
            args_09.field_1.args_ = in_R9.args_;
            args_09.desc_ = (unsigned_long_long)&channelMask;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)&activeTimestamp,(v10 *)"too few arguments",
                       (string_view)ZEXT816(0x11),args_09);
            local_1e8._0_4_ = kInvalidArgs;
            std::__cxx11::string::string((string *)(local_1e8 + 8),(string *)&activeTimestamp);
            Value::Value((Value *)&dataset,(Error *)local_1e8);
            Value::operator=(__return_storage_ptr__,(Value *)&dataset);
            Value::~Value((Value *)&dataset);
            std::__cxx11::string::~string((string *)(local_1e8 + 8));
            psVar12 = (string *)&activeTimestamp;
          }
          else {
            utils::ParseInteger<unsigned_short>
                      ((Error *)local_6e8,(unsigned_short *)&prefix,pbVar4 + 3);
            Value::Value((Value *)&dataset,(Error *)local_6e8);
            pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
            EVar3 = (pVVar9->mError).mCode;
            Value::~Value((Value *)&dataset);
            std::__cxx11::string::~string((string *)(local_6e8 + 8));
            if (EVar3 != kNone) goto LAB_00198353;
            utils::Hex((Error *)local_710,(ByteArray *)this_00,
                       (aExpr->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 4);
            Value::Value((Value *)&dataset,(Error *)local_710);
            pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
            EVar3 = (pVVar9->mError).mCode;
            Value::~Value((Value *)&dataset);
            std::__cxx11::string::~string((string *)(local_710 + 8));
            if (EVar3 != kNone) goto LAB_00198353;
            peVar5 = (aCommissioner->
                     super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x30])
                      (&local_738,peVar5,&prefix);
            Value::Value((Value *)&dataset,&local_738);
            Value::operator=(__return_storage_ptr__,(Value *)&dataset);
            Value::~Value((Value *)&dataset);
            psVar12 = &local_738.mMessage;
          }
        }
        std::__cxx11::string::~string((string *)psVar12);
        goto LAB_00198353;
      }
      pbVar4 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&dataset,"active",(allocator *)&channelMask);
      bVar7 = CaseInsensitiveEqual(pbVar4 + 2,(string *)&dataset);
      std::__cxx11::string::~string((string *)&dataset);
      if (!bVar7) {
        pbVar4 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string((string *)&dataset,"pending",(allocator *)&channelMask);
        bVar7 = CaseInsensitiveEqual(pbVar4 + 2,(string *)&dataset);
        std::__cxx11::string::~string((string *)&dataset);
        if (bVar7) {
          PendingOperationalDataset::PendingOperationalDataset
                    ((PendingOperationalDataset *)&dataset);
          if (bVar6) {
            peVar5 = (aCommissioner->
                     super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x33])
                      (local_850,peVar5,&dataset,0xffff);
            Value::Value((Value *)&channelMask,(Error *)local_850);
            pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&channelMask);
            EVar3 = (pVVar9->mError).mCode;
            Value::~Value((Value *)&channelMask);
            std::__cxx11::string::~string((string *)(local_850 + 8));
            if (EVar3 != kNone) goto LAB_00199d06;
            PendingDatasetToJson_abi_cxx11_(&local_9d0,(commissioner *)&dataset,aDataset_00);
            Value::Value((Value *)&channelMask,&local_9d0);
            Value::operator=(__return_storage_ptr__,(Value *)&channelMask);
            Value::~Value((Value *)&channelMask);
            psVar12 = &local_9d0;
          }
          else {
            pbVar4 = (aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(aExpr->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) < 0x61) {
              prefix._M_dataplus._M_p = prefix._M_dataplus._M_p & 0xffffffff00000000;
              prefix._M_string_length = (size_type)anon_var_dwarf_1d3340;
              prefix.field_2._M_allocated_capacity = 0x11;
              prefix.field_2._8_8_ = 0;
              pcVar10 = "too few arguments";
              while (pcVar11 = pcVar10, pcVar11 != "") {
                pcVar10 = pcVar11 + 1;
                if (*pcVar11 == '}') {
                  if ((pcVar10 == "") || (*pcVar10 != '}')) {
                    ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                  }
                  pcVar10 = pcVar11 + 2;
                }
                else if (*pcVar11 == '{') {
                  pcVar10 = ::fmt::v10::detail::
                            parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                      (pcVar11,"",(format_string_checker<char> *)&prefix);
                }
              }
              args_12.field_1.args_ = in_R9.args_;
              args_12.desc_ = (unsigned_long_long)&prefix;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)&activeTimestamp,(v10 *)"too few arguments",
                         (string_view)ZEXT816(0x11),args_12);
              local_238._0_4_ = kInvalidArgs;
              std::__cxx11::string::string((string *)(local_238 + 8),(string *)&activeTimestamp);
              Value::Value((Value *)&channelMask,(Error *)local_238);
              Value::operator=(__return_storage_ptr__,(Value *)&channelMask);
              Value::~Value((Value *)&channelMask);
              std::__cxx11::string::~string((string *)(local_238 + 8));
              psVar12 = (string *)&activeTimestamp;
            }
            else {
              PendingDatasetFromJson
                        ((Error *)local_800,(PendingOperationalDataset *)&dataset,pbVar4 + 3);
              Value::Value((Value *)&channelMask,(Error *)local_800);
              pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&channelMask);
              EVar3 = (pVVar9->mError).mCode;
              Value::~Value((Value *)&channelMask);
              std::__cxx11::string::~string((string *)(local_800 + 8));
              if (EVar3 != kNone) goto LAB_00199d06;
              peVar5 = (aCommissioner->
                       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x34])
                        (&local_828,peVar5,&dataset);
              Value::Value((Value *)&channelMask,&local_828);
              Value::operator=(__return_storage_ptr__,(Value *)&channelMask);
              Value::~Value((Value *)&channelMask);
              psVar12 = &local_828.mMessage;
            }
          }
          std::__cxx11::string::~string((string *)psVar12);
          goto LAB_00199d06;
        }
        channelMask.
        super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(channelMask.
                               super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0xd);
        channelMask.
        super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_1d976c;
        channelMask.
        super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2b;
        pcVar10 = "{} is not a valid Operational Dataset field";
        activeTimestamp = (Timestamp)&channelMask;
        while (pcVar10 != "") {
          cVar2 = *pcVar10;
          pcVar11 = pcVar10;
          while (cVar2 != '{') {
            pcVar11 = pcVar11 + 1;
            if (pcVar11 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()((writer *)&activeTimestamp,pcVar10,"");
              goto LAB_00199506;
            }
            cVar2 = *pcVar11;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)&activeTimestamp,pcVar10,pcVar11);
          pcVar10 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                              (pcVar11,"",(format_string_checker<char> *)&channelMask);
        }
LAB_00199506:
        pbVar4 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        channelMask.
        super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pbVar4[2]._M_dataplus._M_p;
        channelMask.
        super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)pbVar4[2]._M_string_length;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = (char *)0x2b;
        args_10.field_1.values_ = in_R9.values_;
        args_10.desc_ = (unsigned_long_long)&channelMask;
        ::fmt::v10::vformat_abi_cxx11_
                  (&prefix,(v10 *)"{} is not a valid Operational Dataset field",fmt_00,args_10);
        psVar12 = &local_260.mMessage;
        local_260.mCode = kInvalidArgs;
        std::__cxx11::string::string((string *)psVar12,(string *)&prefix);
        Value::Value((Value *)&dataset,&local_260);
        goto LAB_001974ec;
      }
      ActiveOperationalDataset::ActiveOperationalDataset(&dataset);
      _delay = (pointer)0x0;
      pbStack_a50 = (pointer)0x0;
      local_a48 = (pointer)0x0;
      unresolved.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      unresolved.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      unresolved.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (bVar6) {
        peVar5 = (aCommissioner->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x31])
                  (local_7d8,peVar5,&dataset,0xffff);
        Value::Value((Value *)&channelMask,(Error *)local_7d8);
        pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&channelMask);
        EVar3 = (pVVar9->mError).mCode;
        Value::~Value((Value *)&channelMask);
        std::__cxx11::string::~string((string *)(local_7d8 + 8));
        if (EVar3 == kNone) {
          ActiveDatasetToJson_abi_cxx11_(&local_9b0,(commissioner *)&dataset,aDataset);
          Value::Value((Value *)&channelMask,&local_9b0);
          Value::operator=(__return_storage_ptr__,(Value *)&channelMask);
          Value::~Value((Value *)&channelMask);
          std::__cxx11::string::~string((string *)&local_9b0);
LAB_00198eb7:
          persistent_storage::Network::Network((Network *)&channelMask);
          if ((dataset.mPresentFlags >> 0xc & 1) == 0) {
            if ((dataset.mPresentFlags >> 8 & 1) == 0) {
              if ((dataset.mPresentFlags >> 9 & 1) != 0) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&delay,&dataset.mNetworkName);
                goto LAB_001999cf;
              }
              std::__cxx11::string::string
                        ((string *)&prefix,"Dataset contains no network identification data",
                         (allocator *)&activeTimestamp);
              Console::Write(&prefix,kYellow);
              goto LAB_00199945;
            }
            utils::Hex<unsigned_short>(&prefix,dataset.mPanId);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&delay,
                       &prefix);
            std::__cxx11::string::~string((string *)&prefix);
LAB_001999cf:
            SVar8 = persistent_storage::Registry::GetNetworkXpansByAliases
                              ((this->mRegistry).
                               super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,(StringArray *)&delay,&xpans,&unresolved);
            if ((SVar8 == kSuccess) &&
               ((long)xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start == 8)) goto LAB_0019982c;
            prefix._M_dataplus._M_p = (pointer)0x40000000d;
            prefix._M_string_length = (size_type)anon_var_dwarf_1d9752;
            prefix.field_2._M_allocated_capacity = 0x37;
            prefix.field_2._8_8_ = 0x200000000;
            pcVar10 = "Failed to load network XPAN by alias \'{}\': got {} XPANs";
            write.handler_ =
                 (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&prefix;
            while (pcVar10 != "") {
              cVar2 = *pcVar10;
              pcVar11 = pcVar10;
              while (cVar2 != '{') {
                pcVar11 = pcVar11 + 1;
                if (pcVar11 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                  ::writer::operator()(&write,pcVar10,"");
                  goto LAB_00199ace;
                }
                cVar2 = *pcVar11;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
              ::writer::operator()(&write,pcVar10,pcVar11);
              pcVar10 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,unsigned_long>&>
                                  (pcVar11,"",
                                   (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&prefix);
            }
LAB_00199ace:
            prefix.field_2._M_allocated_capacity =
                 (long)xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
            prefix._M_dataplus._M_p = (_delay->_M_dataplus)._M_p;
            prefix._M_string_length = _delay->_M_string_length;
            fmt_02.size_ = 0x4d;
            fmt_02.data_ = (char *)0x37;
            args_14.field_1.args_ = in_R9.args_;
            args_14.desc_ = (unsigned_long_long)&prefix;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)&activeTimestamp,
                       (v10 *)"Failed to load network XPAN by alias \'{}\': got {} XPANs",fmt_02,
                       args_14);
            Console::Write((string *)&activeTimestamp,kYellow);
            psVar12 = (string *)&activeTimestamp;
LAB_00199b23:
            std::__cxx11::string::~string((string *)psVar12);
          }
          else {
            prefix._M_dataplus._M_p = (pointer)utils::Decode<unsigned_long>(&dataset.mExtendedPanId)
            ;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      (&xpans,(unsigned_long *)&prefix);
LAB_0019982c:
            SVar8 = persistent_storage::Registry::GetNetworkByXpan
                              ((this->mRegistry).
                               super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,*xpans.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                               (Network *)&channelMask);
            if (SVar8 != kSuccess) {
              prefix._M_dataplus._M_p._0_4_ = 0xd;
              prefix._M_string_length = (size_type)anon_var_dwarf_1d975f;
              prefix.field_2._M_allocated_capacity = 0x2a;
              prefix.field_2._8_8_ = 0x100000000;
              pcVar10 = "Failed to find network record by XPAN \'{}\'";
              write.handler_ =
                   (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&prefix;
              while (pcVar10 != "") {
                cVar2 = *pcVar10;
                pcVar11 = pcVar10;
                while (cVar2 != '{') {
                  pcVar11 = pcVar11 + 1;
                  if (pcVar11 == "") {
                    ::fmt::v10::detail::
                    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::writer::operator()((writer *)&write,pcVar10,"");
                    goto LAB_001998f1;
                  }
                  cVar2 = *pcVar11;
                }
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)&write,pcVar10,pcVar11);
                pcVar10 = ::fmt::v10::detail::
                          parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                    (pcVar11,"",(format_string_checker<char> *)&prefix);
              }
LAB_001998f1:
              utils::Hex<unsigned_long>
                        (&prefix,*xpans.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              write.handler_ =
                   (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)prefix._M_dataplus._M_p;
              fmt_01.size_ = 0xd;
              fmt_01.data_ = (char *)0x2a;
              args_13.field_1.args_ = in_R9.args_;
              args_13.desc_ = (unsigned_long_long)&write;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)&activeTimestamp,
                         (v10 *)"Failed to find network record by XPAN \'{}\'",fmt_01,args_13);
              Console::Write((string *)&activeTimestamp,kYellow);
              std::__cxx11::string::~string((string *)&activeTimestamp);
LAB_00199945:
              psVar12 = &prefix;
              goto LAB_00199b23;
            }
            if (((uint)dataset._208_4_ >> 9 & 1) == 0) {
              std::__cxx11::string::string((string *)&prefix,"",(allocator *)&write);
            }
            else {
              std::__cxx11::string::string((string *)&prefix,(string *)&dataset.mNetworkName);
            }
            std::__cxx11::string::operator=
                      ((string *)
                       &channelMask.
                        super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish,(string *)&prefix);
            std::__cxx11::string::~string((string *)&prefix);
            if (((uint)dataset._208_4_ >> 0xc & 1) == 0) {
              activeTimestamp = (Timestamp)((ulong)activeTimestamp & 0xffffffffffffff00);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&prefix,8,
                         (value_type_conflict *)&activeTimestamp,&local_b39);
            }
            else {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&prefix,
                         &dataset.mExtendedPanId);
            }
            utils::Decode<unsigned_long>((ByteArray *)&prefix);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&prefix);
            if (((uint)dataset._208_4_ >> 0xb & 1) == 0) {
              std::__cxx11::string::assign((char *)local_b70);
            }
            else {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_9e8,
                         &dataset.mMeshLocalPrefix);
              Ipv6PrefixToString_abi_cxx11_(&prefix,(commissioner *)&local_9e8,aPrefix);
              std::__cxx11::string::operator=(local_b70,(string *)&prefix);
              std::__cxx11::string::~string((string *)&prefix);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        (&local_9e8);
            }
            if ((dataset.mPresentFlags & 0x40) == 0) {
              prefix._M_dataplus._M_p = prefix._M_dataplus._M_p & 0xffffffffffff0000;
              activeTimestamp = (Timestamp)((ulong)activeTimestamp & 0xffffffffffff0000);
              __l._M_len = 2;
              __l._M_array = (iterator)&activeTimestamp;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &prefix._M_string_length,__l,&local_b3a);
            }
            else {
              SecurityPolicy::SecurityPolicy((SecurityPolicy *)&prefix,&dataset.mSecurityPolicy);
            }
            local_b50 = (uint)((*(byte *)prefix._M_string_length & 0x20) == 0);
            persistent_storage::Registry::Update
                      ((this->mRegistry).
                       super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(Network *)&channelMask);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &prefix._M_string_length);
          }
          persistent_storage::Network::~Network((Network *)&channelMask);
        }
      }
      else {
        pbVar4 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(aExpr->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) < 0x61) {
          prefix._M_dataplus._M_p = prefix._M_dataplus._M_p & 0xffffffff00000000;
          prefix._M_string_length = (size_type)anon_var_dwarf_1d3340;
          prefix.field_2._M_allocated_capacity = 0x11;
          prefix.field_2._8_8_ = 0;
          pcVar10 = "too few arguments";
          while (pcVar11 = pcVar10, pcVar11 != "") {
            pcVar10 = pcVar11 + 1;
            if (*pcVar11 == '}') {
              if ((pcVar10 == "") || (*pcVar10 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar10 = pcVar11 + 2;
            }
            else if (*pcVar11 == '{') {
              pcVar10 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                  (pcVar11,"",(format_string_checker<char> *)&prefix);
            }
          }
          args_11.field_1.args_ = in_R9.args_;
          args_11.desc_ = (unsigned_long_long)&prefix;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&activeTimestamp,(v10 *)"too few arguments",
                     (string_view)ZEXT816(0x11),args_11);
          local_210._0_4_ = kInvalidArgs;
          std::__cxx11::string::string((string *)(local_210 + 8),(string *)&activeTimestamp);
          Value::Value((Value *)&channelMask,(Error *)local_210);
          Value::operator=(__return_storage_ptr__,(Value *)&channelMask);
          Value::~Value((Value *)&channelMask);
          std::__cxx11::string::~string((string *)(local_210 + 8));
          std::__cxx11::string::~string((string *)&activeTimestamp);
        }
        else {
          ActiveDatasetFromJson((Error *)local_788,&dataset,pbVar4 + 3);
          Value::Value((Value *)&channelMask,(Error *)local_788);
          pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&channelMask);
          EVar3 = (pVVar9->mError).mCode;
          Value::~Value((Value *)&channelMask);
          std::__cxx11::string::~string((string *)(local_788 + 8));
          if (EVar3 == kNone) {
            peVar5 = (aCommissioner->
                     super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x32])
                      (local_7b0,peVar5,&dataset);
            Value::Value((Value *)&channelMask,(Error *)local_7b0);
            pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&channelMask);
            EVar3 = (pVVar9->mError).mCode;
            Value::~Value((Value *)&channelMask);
            std::__cxx11::string::~string((string *)(local_7b0 + 8));
            if (EVar3 == kNone) goto LAB_00198eb7;
          }
        }
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&unresolved);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&delay);
LAB_00199d06:
      ActiveOperationalDataset::~ActiveOperationalDataset(&dataset);
      return __return_storage_ptr__;
    }
    prefix._M_string_length = 0;
    prefix.field_2._M_allocated_capacity = prefix.field_2._M_allocated_capacity & 0xffffffffffffff00
    ;
    prefix._M_dataplus._M_p = (pointer)paVar1;
    if (!bVar6) {
      pbVar4 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(aExpr->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) < 0x81) {
        channelMask.
        super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)channelMask.
                              super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
        channelMask.
        super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_1d3340;
        channelMask.
        super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x11;
        pcVar10 = "too few arguments";
        while (pcVar11 = pcVar10, pcVar11 != "") {
          pcVar10 = pcVar11 + 1;
          if (*pcVar11 == '}') {
            if ((pcVar10 == "") || (*pcVar10 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar10 = pcVar11 + 2;
          }
          else if (*pcVar11 == '{') {
            pcVar10 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                (pcVar11,"",(format_string_checker<char> *)&channelMask);
          }
        }
        args_04.field_1.args_ = in_R9.args_;
        args_04.desc_ = (unsigned_long_long)&channelMask;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&activeTimestamp,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),
                   args_04);
        psVar13 = (string *)(local_120 + 8);
        local_120._0_4_ = kInvalidArgs;
        std::__cxx11::string::string(psVar13,(string *)&activeTimestamp);
        Value::Value((Value *)&dataset,(Error *)local_120);
LAB_00198673:
        Value::operator=(__return_storage_ptr__,(Value *)&dataset);
        Value::~Value((Value *)&dataset);
        std::__cxx11::string::~string(psVar13);
        psVar12 = (string *)&activeTimestamp;
      }
      else {
        utils::ParseInteger<unsigned_int>((Error *)local_468,&delay,pbVar4 + 4);
        Value::Value((Value *)&dataset,(Error *)local_468);
        pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
        EVar3 = (pVVar9->mError).mCode;
        Value::~Value((Value *)&dataset);
        std::__cxx11::string::~string((string *)(local_468 + 8));
        if (EVar3 != kNone) goto LAB_0019750f;
        peVar5 = (aCommissioner->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x25])
                  (&local_490,peVar5,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 3,(ulong)_delay & 0xffffffff);
        Value::Value((Value *)&dataset,&local_490);
        Value::operator=(__return_storage_ptr__,(Value *)&dataset);
        Value::~Value((Value *)&dataset);
        psVar12 = &local_490.mMessage;
      }
      goto LAB_0019750a;
    }
    peVar5 = (aCommissioner->
             super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x24])(local_4b8,peVar5,&prefix)
    ;
    Value::Value((Value *)&dataset,(Error *)local_4b8);
    pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
    EVar3 = (pVVar9->mError).mCode;
    Value::~Value((Value *)&dataset);
    std::__cxx11::string::~string((string *)(local_4b8 + 8));
    if (EVar3 == kNone) {
      std::__cxx11::string::string((string *)&local_8f0,(string *)&prefix);
      Value::Value((Value *)&dataset,&local_8f0);
      Value::operator=(__return_storage_ptr__,(Value *)&dataset);
      Value::~Value((Value *)&dataset);
      psVar12 = &local_8f0;
      goto LAB_0019750a;
    }
  }
LAB_0019750f:
  psVar12 = &prefix;
LAB_00197514:
  std::__cxx11::string::~string((string *)psVar12);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessOpDatasetJob(CommissionerAppPtr &aCommissioner, const Expression &aExpr)
{
    Value value;
    bool  isSet;

    VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    if (CaseInsensitiveEqual(aExpr[1], "get"))
    {
        isSet = false;
    }
    else if (CaseInsensitiveEqual(aExpr[1], "set"))
    {
        isSet = true;
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

    if (CaseInsensitiveEqual(aExpr[2], "activetimestamp"))
    {
        Timestamp activeTimestamp;
        VerifyOrExit(!isSet, value = ERROR_INVALID_ARGS("cannot set activetimestamp"));
        SuccessOrExit(value = aCommissioner->GetActiveTimestamp(activeTimestamp));
        value = ToString(activeTimestamp);
    }
    else if (CaseInsensitiveEqual(aExpr[2], "channel"))
    {
        Channel channel;
        if (isSet)
        {
            uint32_t delay;
            VerifyOrExit(aExpr.size() >= 6, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = ParseInteger(channel.mPage, aExpr[3]));
            SuccessOrExit(value = ParseInteger(channel.mNumber, aExpr[4]));
            SuccessOrExit(value = ParseInteger(delay, aExpr[5]));
            SuccessOrExit(value = aCommissioner->SetChannel(channel, CommissionerApp::MilliSeconds(delay)));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetChannel(channel));
            value = ToString(channel);
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "channelmask"))
    {
        ChannelMask channelMask;
        if (isSet)
        {
            SuccessOrExit(value = ParseChannelMask(channelMask, aExpr, 3));
            SuccessOrExit(value = aCommissioner->SetChannelMask(channelMask));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetChannelMask(channelMask));
            value = ToString(channelMask);
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "xpanid"))
    {
        ByteArray xpanid;
        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = utils::Hex(xpanid, aExpr[3]));
            SuccessOrExit(value = aCommissioner->SetExtendedPanId(xpanid));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetExtendedPanId(xpanid));
            value = utils::Hex(xpanid);
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "meshlocalprefix"))
    {
        std::string prefix;
        if (isSet)
        {
            uint32_t delay;
            VerifyOrExit(aExpr.size() >= 5, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = ParseInteger(delay, aExpr[4]));
            SuccessOrExit(value = aCommissioner->SetMeshLocalPrefix(aExpr[3], CommissionerApp::MilliSeconds(delay)));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetMeshLocalPrefix(prefix));
            value = prefix;
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "networkmasterkey"))
    {
        ByteArray masterKey;
        if (isSet)
        {
            uint32_t delay;
            VerifyOrExit(aExpr.size() >= 5, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = utils::Hex(masterKey, aExpr[3]));
            SuccessOrExit(value = ParseInteger(delay, aExpr[4]));
            SuccessOrExit(value = aCommissioner->SetNetworkMasterKey(masterKey, CommissionerApp::MilliSeconds(delay)));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetNetworkMasterKey(masterKey));
            value = utils::Hex(masterKey);
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "networkname"))
    {
        std::string networkName;
        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = aCommissioner->SetNetworkName(aExpr[3]));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetNetworkName(networkName));
            value = networkName;
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "panid"))
    {
        uint16_t panid;
        if (isSet)
        {
            uint32_t delay;
            VerifyOrExit(aExpr.size() >= 5, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = ParseInteger(panid, aExpr[3]));
            SuccessOrExit(value = ParseInteger(delay, aExpr[4]));
            SuccessOrExit(value = aCommissioner->SetPanId(panid, CommissionerApp::MilliSeconds(delay)));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetPanId(panid));
            value = Hex(panid);
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "pskc"))
    {
        ByteArray pskc;
        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = utils::Hex(pskc, aExpr[3]));
            SuccessOrExit(value = aCommissioner->SetPSKc(pskc));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetPSKc(pskc));
            value = utils::Hex(pskc);
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "securitypolicy"))
    {
        SecurityPolicy policy;
        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 5, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = ParseInteger(policy.mRotationTime, aExpr[3]));
            SuccessOrExit(value = utils::Hex(policy.mFlags, aExpr[4]));
            SuccessOrExit(value = aCommissioner->SetSecurityPolicy(policy));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetSecurityPolicy(policy));
            value = ToString(policy);
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "active"))
    {
        ActiveOperationalDataset dataset;
        StringArray              nwkAliases;
        StringArray              unresolved;
        std::vector<uint64_t>    xpans;

        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = ActiveDatasetFromJson(dataset, aExpr[3]));
            SuccessOrExit(value = aCommissioner->SetActiveDataset(dataset));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetActiveDataset(dataset, 0xFFFF));
            value = ActiveDatasetToJson(dataset);
        }
        // Update network from active opdataset (no error there, log messages only)
        do
        {
            Network nwk;
            // Get network object for the opdataset object
            if ((dataset.mPresentFlags & ActiveOperationalDataset::kExtendedPanIdBit) != 0)
            {
                xpans.push_back(utils::Decode<uint64_t>(dataset.mExtendedPanId));
            }
            else
            {
                if ((dataset.mPresentFlags & ActiveOperationalDataset::kPanIdBit) != 0)
                {
                    nwkAliases.push_back(Hex(dataset.mPanId));
                }
                else if ((dataset.mPresentFlags & ActiveOperationalDataset::kNetworkNameBit) != 0)
                {
                    nwkAliases.push_back(dataset.mNetworkName);
                }
                else
                {
                    Console::Write("Dataset contains no network identification data", Console::Color::kYellow);
                    break;
                }
                if (mRegistry->GetNetworkXpansByAliases(nwkAliases, xpans, unresolved) != RegistryStatus::kSuccess ||
                    xpans.size() != 1)
                {
                    Console::Write(fmt::format(FMT_STRING("Failed to load network XPAN by alias '{}': got {} XPANs"),
                                               nwkAliases[0], xpans.size()),
                                   Console::Color::kYellow);
                    break;
                }
            }
            if (mRegistry->GetNetworkByXpan(xpans[0], nwk) != RegistryStatus::kSuccess)
            {
                Console::Write(
                    fmt::format(FMT_STRING("Failed to find network record by XPAN '{}'"), utils::Hex(xpans[0])),
                    Console::Color::kYellow);
                break; /// @todo It is possible that network XPAN ID
                       ///       might have change since the last sync
                       ///       so maybe it is worth to look up for
                       ///       the network by name or PAN ID as well
                       ///       to apply the change
            }

// Update network object
#define AODS_FIELD_IF_IS_SET(field, defaultValue) \
    (((dataset.mPresentFlags & ActiveOperationalDataset::k##field##Bit) == 0) ? (defaultValue) : (dataset.m##field))

            nwk.mName = AODS_FIELD_IF_IS_SET(NetworkName, "");
            nwk.mXpan =
                utils::Decode<uint64_t>(AODS_FIELD_IF_IS_SET(ExtendedPanId, ByteArray(kExtendedPanIdLength, 0)));
            nwk.mChannel = AODS_FIELD_IF_IS_SET(Channel, (Channel{0, 0})).mNumber;
            nwk.mPan     = AODS_FIELD_IF_IS_SET(PanId, 0);
            if ((dataset.mPresentFlags & ActiveOperationalDataset::kPanIdBit) == 0)
            {
                nwk.mPan = 0;
            }
            else
            {
                nwk.mPan = dataset.mPanId;
            }

            if ((dataset.mPresentFlags & ActiveOperationalDataset::kMeshLocalPrefixBit) == 0)
            {
                nwk.mMlp = "";
            }
            else
            {
                nwk.mMlp = Ipv6PrefixToString(dataset.mMeshLocalPrefix);
            }

            SecurityPolicy sp = AODS_FIELD_IF_IS_SET(SecurityPolicy, (SecurityPolicy{0, ByteArray{0, 0}}));
            nwk.mCcm          = !(sp.mFlags[0] & kSecurityPolicyBit_CCM);
#undef AODS_FIELD_IF_IS_SET
            // Store network object in the registry
            mRegistry->Update(nwk);
        } while (false);
    }
    else if (CaseInsensitiveEqual(aExpr[2], "pending"))
    {
        PendingOperationalDataset dataset;
        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = PendingDatasetFromJson(dataset, aExpr[3]));
            SuccessOrExit(value = aCommissioner->SetPendingDataset(dataset));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetPendingDataset(dataset, 0xFFFF));
            value = PendingDatasetToJson(dataset);
        }
    }
    else
    {
        value = ERROR_INVALID_ARGS("{} is not a valid Operational Dataset field", aExpr[2]);
    }

exit:
    return value;
}